

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O0

void __thiscall
asio::detail::op_queue<asio::detail::scheduler_operation>::pop
          (op_queue<asio::detail::scheduler_operation> *this)

{
  scheduler_operation *psVar1;
  long *in_RDI;
  scheduler_operation *tmp;
  scheduler_operation *local_10 [2];
  
  if (*in_RDI != 0) {
    local_10[0] = (scheduler_operation *)*in_RDI;
    psVar1 = op_queue_access::next<asio::detail::scheduler_operation>
                       ((scheduler_operation *)*in_RDI);
    *in_RDI = (long)psVar1;
    if (*in_RDI == 0) {
      in_RDI[1] = 0;
    }
    op_queue_access::next<asio::detail::scheduler_operation,asio::detail::scheduler_operation>
              (local_10,(scheduler_operation *)0x0);
  }
  return;
}

Assistant:

void pop()
  {
    if (front_)
    {
      Operation* tmp = front_;
      front_ = op_queue_access::next(front_);
      if (front_ == 0)
        back_ = 0;
      op_queue_access::next(tmp, static_cast<Operation*>(0));
    }
  }